

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bcast.cpp
# Opt level: O0

void Omega_h::bcast_mesh(Mesh *mesh,CommPtr *new_comm,bool is_source)

{
  Int IVar1;
  Int ent_dim;
  CommPtr *pCVar2;
  I32 IVar3;
  element_type *peVar4;
  string *psVar5;
  size_type sVar6;
  pointer ppVar7;
  size_type sVar8;
  reference pvVar9;
  mapped_type *this;
  value_type local_2d0;
  ClassPair pair;
  I32 j;
  I32 npairs;
  string name_1;
  int local_29c;
  I32 i_1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>
  local_290;
  iterator it;
  I32 nsets;
  initializer_list<double> local_260;
  Read<double> local_250;
  allocator local_239;
  string local_238 [32];
  initializer_list<long> local_218;
  Read<long> local_208;
  allocator local_1f1;
  string local_1f0 [32];
  initializer_list<int> local_1d0;
  Read<int> local_1c0;
  allocator local_1a9;
  string local_1a8 [32];
  initializer_list<signed_char> local_188;
  Read<signed_char> local_178;
  int local_168;
  Int local_164;
  I32 tag_type;
  I32 ncomps;
  string name;
  TagBase *local_140;
  TagBase *tag;
  Int i;
  I32 ntags;
  allocator local_f9;
  string local_f8 [32];
  initializer_list<signed_char> local_d8;
  Read<signed_char> local_c8 [2];
  allocator local_a1;
  string local_a0 [32];
  initializer_list<int> local_80;
  Read<int> local_70;
  undefined1 local_60 [8];
  Adj down;
  Omega_h_Parting local_28;
  Int d;
  I32 parting;
  I32 dim;
  I32 family;
  bool is_source_local;
  CommPtr *new_comm_local;
  Mesh *mesh_local;
  
  dim._3_1_ = is_source;
  _family = new_comm;
  new_comm_local = (CommPtr *)mesh;
  peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)new_comm);
  IVar3 = Comm::rank(peVar4);
  if ((IVar3 == 0) && ((dim._3_1_ & 1) == 0)) {
    fail("assertion %s failed at %s +%d\n","is_source",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_bcast.cpp"
         ,9);
  }
  if ((dim._3_1_ & 1) != 0) {
    parting = Mesh::family((Mesh *)new_comm_local);
  }
  peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)new_comm);
  Comm::bcast<int>(peVar4,&parting,0);
  if ((dim._3_1_ & 1) == 0) {
    Mesh::set_family((Mesh *)new_comm_local,parting);
  }
  if ((dim._3_1_ & 1) != 0) {
    d = Mesh::dim((Mesh *)new_comm_local);
  }
  peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)new_comm);
  Comm::bcast<int>(peVar4,&d,0);
  if ((dim._3_1_ & 1) == 0) {
    Mesh::set_dim((Mesh *)new_comm_local,d);
  }
  if ((dim._3_1_ & 1) != 0) {
    local_28 = Mesh::parting((Mesh *)new_comm_local);
  }
  peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)new_comm);
  Comm::bcast<int>(peVar4,(int *)&local_28,0);
  if ((dim._3_1_ & 1) == 0) {
    Mesh::set_parting((Mesh *)new_comm_local,local_28,false);
  }
  if ((dim._3_1_ & 1) == 0) {
    Mesh::set_verts((Mesh *)new_comm_local,0);
  }
  for (down.codes.write_.shared_alloc_.direct_ptr._4_4_ = 0;
      down.codes.write_.shared_alloc_.direct_ptr._4_4_ <= d;
      down.codes.write_.shared_alloc_.direct_ptr._4_4_ =
           down.codes.write_.shared_alloc_.direct_ptr._4_4_ + 1) {
    if ((0 < down.codes.write_.shared_alloc_.direct_ptr._4_4_) && ((dim._3_1_ & 1) == 0)) {
      std::initializer_list<int>::initializer_list(&local_80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"",&local_a1);
      Read<int>::Read(&local_70,local_80,(string *)local_a0);
      Adj::Adj((Adj *)local_60,&local_70);
      Read<int>::~Read(&local_70);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      if (down.codes.write_.shared_alloc_.direct_ptr._4_4_ != 1) {
        std::initializer_list<signed_char>::initializer_list(&local_d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f8,"",&local_f9);
        Read<signed_char>::Read(local_c8,local_d8,(string *)local_f8);
        Read<signed_char>::operator=
                  ((Read<signed_char> *)&down.super_Graph.ab2b.write_.shared_alloc_.direct_ptr,
                   local_c8);
        Read<signed_char>::~Read(local_c8);
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      }
      pCVar2 = new_comm_local;
      IVar1 = down.codes.write_.shared_alloc_.direct_ptr._4_4_;
      Adj::Adj((Adj *)&i,(Adj *)local_60);
      Mesh::set_ents((Mesh *)pCVar2,IVar1,(Adj *)&i);
      Adj::~Adj((Adj *)&i);
      Adj::~Adj((Adj *)local_60);
    }
    if ((dim._3_1_ & 1) != 0) {
      tag._4_4_ = Mesh::ntags((Mesh *)new_comm_local,
                              down.codes.write_.shared_alloc_.direct_ptr._4_4_);
    }
    peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)new_comm);
    Comm::bcast<int>(peVar4,(int *)((long)&tag + 4),0);
    for (tag._0_4_ = 0; (int)tag < tag._4_4_; tag._0_4_ = (int)tag + 1) {
      local_140 = (TagBase *)0x0;
      if ((dim._3_1_ & 1) != 0) {
        local_140 = Mesh::get_tag((Mesh *)new_comm_local,
                                  down.codes.write_.shared_alloc_.direct_ptr._4_4_,(int)tag);
      }
      std::__cxx11::string::string((string *)&tag_type);
      if ((dim._3_1_ & 1) != 0) {
        psVar5 = TagBase::name_abi_cxx11_(local_140);
        std::__cxx11::string::operator=((string *)&tag_type,(string *)psVar5);
      }
      peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)new_comm);
      Comm::bcast_string(peVar4,(string *)&tag_type,0);
      if ((dim._3_1_ & 1) != 0) {
        local_164 = TagBase::ncomps(local_140);
      }
      peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)new_comm);
      Comm::bcast<int>(peVar4,&local_164,0);
      if ((dim._3_1_ & 1) != 0) {
        local_168 = (*local_140->_vptr_TagBase[2])();
      }
      peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)new_comm);
      Comm::bcast<int>(peVar4,&local_168,0);
      pCVar2 = new_comm_local;
      ent_dim = down.codes.write_.shared_alloc_.direct_ptr._4_4_;
      IVar1 = local_164;
      if ((dim._3_1_ & 1) == 0) {
        switch(local_168) {
        case 0:
          std::initializer_list<signed_char>::initializer_list(&local_188);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1a8,"",&local_1a9);
          Read<signed_char>::Read(&local_178,local_188,(string *)local_1a8);
          Mesh::add_tag<signed_char>
                    ((Mesh *)pCVar2,ent_dim,(string *)&tag_type,IVar1,&local_178,false);
          Read<signed_char>::~Read(&local_178);
          std::__cxx11::string::~string(local_1a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
          break;
        case 2:
          std::initializer_list<int>::initializer_list(&local_1d0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f0,"",&local_1f1);
          Read<int>::Read(&local_1c0,local_1d0,(string *)local_1f0);
          Mesh::add_tag<int>((Mesh *)pCVar2,ent_dim,(string *)&tag_type,IVar1,&local_1c0,false);
          Read<int>::~Read(&local_1c0);
          std::__cxx11::string::~string(local_1f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
          break;
        case 3:
          std::initializer_list<long>::initializer_list(&local_218);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_238,"",&local_239);
          Read<long>::Read(&local_208,local_218,(string *)local_238);
          Mesh::add_tag<long>((Mesh *)pCVar2,ent_dim,(string *)&tag_type,IVar1,&local_208,false);
          Read<long>::~Read(&local_208);
          std::__cxx11::string::~string(local_238);
          std::allocator<char>::~allocator((allocator<char> *)&local_239);
          break;
        case 5:
          std::initializer_list<double>::initializer_list(&local_260);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&nsets,"",(allocator *)((long)&it._M_node + 7));
          Read<double>::Read(&local_250,local_260,(string *)&nsets);
          Mesh::add_tag<double>((Mesh *)pCVar2,ent_dim,(string *)&tag_type,IVar1,&local_250,false);
          Read<double>::~Read(&local_250);
          std::__cxx11::string::~string((string *)&nsets);
          std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
        }
      }
      std::__cxx11::string::~string((string *)&tag_type);
    }
  }
  if ((dim._3_1_ & 1) != 0) {
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                    *)&new_comm_local[0x3a].
                       super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    it._M_node._0_4_ = (int)sVar6;
  }
  peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)new_comm);
  Comm::bcast<int>(peVar4,(int *)&it,0);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>
  ::_Rb_tree_iterator(&local_290);
  if ((dim._3_1_ & 1) != 0) {
    local_290._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                  *)&new_comm_local[0x3a].
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  for (local_29c = 0; local_29c < (int)it._M_node; local_29c = local_29c + 1) {
    std::__cxx11::string::string((string *)&j);
    if ((dim._3_1_ & 1) != 0) {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>
               ::operator->(&local_290);
      std::__cxx11::string::operator=((string *)&j,(string *)ppVar7);
    }
    peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)new_comm);
    Comm::bcast_string(peVar4,(string *)&j,0);
    if ((dim._3_1_ & 1) != 0) {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>
               ::operator->(&local_290);
      sVar8 = std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::size
                        (&ppVar7->second);
      pair.id = (LO)sVar8;
    }
    peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)new_comm);
    Comm::bcast<int>(peVar4,&pair.id,0);
    for (pair.dim = 0; pair.dim < pair.id; pair.dim = pair.dim + 1) {
      if ((dim._3_1_ & 1) != 0) {
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>
                 ::operator->(&local_290);
        pvVar9 = std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator[]
                           (&ppVar7->second,(long)pair.dim);
        local_2d0 = *pvVar9;
      }
      peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)new_comm);
      Comm::bcast<int>(peVar4,&local_2d0.dim,0);
      peVar4 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)new_comm);
      Comm::bcast<int>(peVar4,&local_2d0.id,0);
      if ((dim._3_1_ & 1) == 0) {
        this = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                             *)&new_comm_local[0x3a].
                                super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,(key_type *)&j);
        std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::push_back
                  (this,&local_2d0);
      }
    }
    if ((dim._3_1_ & 1) != 0) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>
      ::operator++(&local_290);
    }
    std::__cxx11::string::~string((string *)&j);
  }
  return;
}

Assistant:

void bcast_mesh(Mesh* mesh, CommPtr new_comm, bool is_source) {
  if (new_comm->rank() == 0) {
    OMEGA_H_CHECK(is_source);
  }
  I32 family;
  if (is_source) family = mesh->family();
  new_comm->bcast(family);
  if (!is_source) mesh->set_family(Omega_h_Family(family));
  I32 dim;
  if (is_source) dim = mesh->dim();
  new_comm->bcast(dim);
  if (!is_source) mesh->set_dim(dim);
  I32 parting;
  if (is_source) parting = mesh->parting();
  new_comm->bcast(parting);
  if (!is_source) mesh->set_parting(Omega_h_Parting(parting));
  if (!is_source) mesh->set_verts(0);
  for (Int d = 0; d <= dim; ++d) {
    if (d > VERT && !is_source) {
      Adj down(LOs({}));
      if (d - 1 != VERT) down.codes = Read<I8>({});
      mesh->set_ents(d, down);
    }
    I32 ntags;
    if (is_source) ntags = mesh->ntags(d);
    new_comm->bcast(ntags);
    for (Int i = 0; i < ntags; ++i) {
      TagBase const* tag = nullptr;
      if (is_source) tag = mesh->get_tag(d, i);
      std::string name;
      if (is_source) name = tag->name();
      new_comm->bcast_string(name);
      I32 ncomps;
      if (is_source) ncomps = tag->ncomps();
      new_comm->bcast(ncomps);
      I32 tag_type;
      if (is_source) tag_type = tag->type();
      new_comm->bcast(tag_type);
      if (!is_source) {
        switch (tag_type) {
          case OMEGA_H_I8:
            mesh->add_tag(d, name, ncomps, Read<I8>({}));
            break;
          case OMEGA_H_I32:
            mesh->add_tag(d, name, ncomps, Read<I32>({}));
            break;
          case OMEGA_H_I64:
            mesh->add_tag(d, name, ncomps, Read<I64>({}));
            break;
          case OMEGA_H_F64:
            mesh->add_tag(d, name, ncomps, Read<Real>({}));
            break;
        }
      }
    }
  }
  I32 nsets;
  if (is_source) nsets = I32(mesh->class_sets.size());
  new_comm->bcast(nsets);
  decltype(mesh->class_sets)::iterator it;
  if (is_source) it = mesh->class_sets.begin();
  for (I32 i = 0; i < nsets; ++i) {
    std::string name;
    if (is_source) name = it->first;
    new_comm->bcast_string(name);
    I32 npairs;
    if (is_source) npairs = I32(it->second.size());
    new_comm->bcast(npairs);
    for (I32 j = 0; j < npairs; ++j) {
      ClassPair pair;
      if (is_source) pair = it->second[std::size_t(j)];
      new_comm->bcast(pair.dim);
      new_comm->bcast(pair.id);
      if (!is_source) mesh->class_sets[name].push_back(pair);
    }
    if (is_source) ++it;
  }
}